

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.cpp
# Opt level: O3

ostream * subsat::operator<<(ostream *os,ConstraintRef cr)

{
  std::__ostream_insert<char,std::char_traits<char>>(os,"ConstraintRef{",0xe);
  if (cr.m_index == 0xffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"-",1);
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"}",1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, ConstraintRef cr)
{
  os << "ConstraintRef{";
  if (cr.is_valid()) {
    os << cr.index();
  } else {
    os << "-";
  }
  os << "}";
  return os;
}